

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

int xmlC14NExecute(xmlDocPtr doc,xmlC14NIsVisibleCallback is_visible_callback,void *user_data,
                  int mode,xmlChar **inclusive_ns_prefixes,int with_comments,xmlOutputBufferPtr buf)

{
  xmlC14NCtxPtr ctx;
  xmlC14NVisibleNsStackPtr p_Var1;
  char *pcVar2;
  int iVar3;
  
  if (doc == (xmlDocPtr)0x0 || buf == (xmlOutputBufferPtr)0x0) {
    pcVar2 = "executing c14n";
  }
  else {
    if ((uint)mode < 3) {
      if (buf->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        ctx = (xmlC14NCtxPtr)(*xmlMalloc)(0x50);
        if (ctx == (xmlC14NCtxPtr)0x0) {
          xmlC14NErrMemory("creating context");
        }
        else {
          *(undefined8 *)&ctx->with_comments = 0;
          ctx->buf = (xmlOutputBufferPtr)0x0;
          ctx->pos = XMLC14N_BEFORE_DOCUMENT_ELEMENT;
          ctx->parent_is_doc = 0;
          ctx->ns_rendered = (xmlC14NVisibleNsStackPtr)0x0;
          *(undefined8 *)&ctx->mode = 0;
          ctx->inclusive_ns_prefixes = (xmlChar **)0x0;
          *(undefined8 *)&ctx->error = 0;
          ctx->doc = doc;
          ctx->with_comments = with_comments;
          ctx->is_visible_callback = is_visible_callback;
          ctx->user_data = user_data;
          ctx->buf = buf;
          ctx->parent_is_doc = 1;
          p_Var1 = (xmlC14NVisibleNsStackPtr)(*xmlMalloc)(0x20);
          if (p_Var1 != (xmlC14NVisibleNsStackPtr)0x0) {
            p_Var1->nsTab = (xmlNsPtr *)0x0;
            p_Var1->nodeTab = (xmlNodePtr *)0x0;
            p_Var1->nsCurEnd = 0;
            p_Var1->nsPrevStart = 0;
            p_Var1->nsPrevEnd = 0;
            p_Var1->nsMax = 0;
            ctx->ns_rendered = p_Var1;
            ctx->mode = mode;
            if (mode == 1) {
              ctx->inclusive_ns_prefixes = inclusive_ns_prefixes;
            }
            if ((doc->children == (xmlNodePtr)0x0) ||
               (iVar3 = xmlC14NProcessNodeList(ctx,doc->children), -1 < iVar3)) {
              iVar3 = xmlOutputBufferFlush(buf);
              if (-1 < iVar3) {
                xmlC14NFreeCtx(ctx);
                return iVar3;
              }
              pcVar2 = "flushing output buffer";
            }
            else {
              pcVar2 = "processing docs children list";
            }
            xmlC14NErrInternal(pcVar2);
            xmlC14NFreeCtx(ctx);
            return -1;
          }
          xmlC14NErrMemory("creating namespaces stack");
          ctx->ns_rendered = (xmlC14NVisibleNsStackPtr)0x0;
          ctx->error = 0x7a0;
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctx,doc,
                          0x15,0x7a0,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,(char *)0x0
                          ,0,0,"%s","xmlC14NNewCtx: xmlC14NVisibleNsStackCreate failed\n");
          xmlC14NFreeCtx(ctx);
        }
        pcVar2 = "xmlC14NExecute: unable to create C14N context\n";
        iVar3 = 0x79e;
      }
      else {
        pcVar2 = "xmlC14NExecute: output buffer encoder != NULL but C14N requires UTF8 output\n";
        iVar3 = 0x79f;
      }
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      doc,0x15,iVar3,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,(char *)0x0
                      ,0,0,"%s",pcVar2);
      return -1;
    }
    pcVar2 = "invalid mode for executing c14n";
  }
  xmlC14NErrParam(pcVar2);
  return -1;
}

Assistant:

int
xmlC14NExecute(xmlDocPtr doc, xmlC14NIsVisibleCallback is_visible_callback,
	 void* user_data, int mode, xmlChar **inclusive_ns_prefixes,
	 int with_comments, xmlOutputBufferPtr buf) {

    xmlC14NCtxPtr ctx;
    xmlC14NMode c14n_mode = XML_C14N_1_0;
    int ret;

    if ((buf == NULL) || (doc == NULL)) {
        xmlC14NErrParam("executing c14n");
        return (-1);
    }

    /* for backward compatibility, we have to have "mode" as "int"
       and here we check that user gives valid value */
    switch(mode) {
    case XML_C14N_1_0:
    case XML_C14N_EXCLUSIVE_1_0:
    case XML_C14N_1_1:
         c14n_mode = (xmlC14NMode)mode;
         break;
    default:
        xmlC14NErrParam("invalid mode for executing c14n");
        return (-1);
    }

    /*
     *  Validate the encoding output buffer encoding
     */
    if (buf->encoder != NULL) {
        xmlC14NErr(NULL, (xmlNodePtr) doc, XML_C14N_REQUIRES_UTF8,
"xmlC14NExecute: output buffer encoder != NULL but C14N requires UTF8 output\n");
        return (-1);
    }

    ctx = xmlC14NNewCtx(doc, is_visible_callback, user_data,
	            c14n_mode, inclusive_ns_prefixes,
                    with_comments, buf);
    if (ctx == NULL) {
        xmlC14NErr(NULL, (xmlNodePtr) doc, XML_C14N_CREATE_CTXT,
		   "xmlC14NExecute: unable to create C14N context\n");
        return (-1);
    }



    /*
     * Root Node
     * The root node is the parent of the top-level document element. The
     * result of processing each of its child nodes that is in the node-set
     * in document order. The root node does not generate a byte order mark,
     * XML declaration, nor anything from within the document type
     * declaration.
     */
    if (doc->children != NULL) {
        ret = xmlC14NProcessNodeList(ctx, doc->children);
        if (ret < 0) {
            xmlC14NErrInternal("processing docs children list");
            xmlC14NFreeCtx(ctx);
            return (-1);
        }
    }

    /*
     * Flush buffer to get number of bytes written
     */
    ret = xmlOutputBufferFlush(buf);
    if (ret < 0) {
        xmlC14NErrInternal("flushing output buffer");
        xmlC14NFreeCtx(ctx);
        return (-1);
    }

    /*
     * Cleanup
     */
    xmlC14NFreeCtx(ctx);
    return (ret);
}